

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_footprints.cpp
# Opt level: O2

void __thiscall cp::PlanFootprints::calcNextWaistPose(PlanFootprints *this)

{
  Vector3 waist_pos;
  Quat waist_r;
  Quat QStack_98;
  Vector3 local_78;
  Pose *local_60;
  Vector3 *local_58;
  QuaternionBase<Eigen::Quaternion<double,_0>_> local_48 [32];
  
  rpy2q(&QStack_98,0.0,0.0,*(double *)(this + 0x300));
  Eigen::internal::
  quat_product<1,_Eigen::Quaternion<double,_0>,_Eigen::Quaternion<double,_0>,_double>::run
            ((QuaternionBase<Eigen::Quaternion<double,_0>_> *)(this + 0x1f0),
             (QuaternionBase<Eigen::Quaternion<double,_0>_> *)&QStack_98);
  Eigen::QuaternionBase<Eigen::Quaternion<double,_0>_>::_transformVector
            (&local_78,local_48,(Vector3 *)(this + 0x2e8));
  local_60 = (Pose *)(this + 0x1d0);
  local_58 = &local_78;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&QStack_98,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&local_60);
  QStack_98.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
  array[2] = 0.0;
  Pose::set((Pose *)(this + 0x1d0),(Vector3 *)&QStack_98,(Quat *)local_48);
  return;
}

Assistant:

void PlanFootprints::calcNextWaistPose() {
  Quat waist_r = ref_waist_pose.q() * rpy2q(0.0, 0.0, step_angle);
  Vector3 waist_pos = ref_waist_pose.p() + waist_r * step_vector;
  waist_pos.z() = 0.0;
  ref_waist_pose.set(waist_pos, waist_r);
}